

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O1

void __thiscall
lzham::lzcompressor::state::get_rep_match_costs
          (state *this,uint dict_pos,bit_cost_t *pBitcosts,uint match_hist_index,int min_len,
          int max_len,uint is_match_model_index)

{
  ushort uVar1;
  uint uVar2;
  uchar *puVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  uVar4 = (ulong)(this->super_state_base).m_cur_state;
  lVar7 = (ulong)*(uint *)(gProbCost +
                          (ulong)(0x800 - *(ushort *)((long)this->m_lit_table + uVar4 * 2 + -0x7c))
                          * 4) +
          (ulong)*(uint *)(gProbCost +
                          (ulong)(0x800 - *(ushort *)
                                           ((long)(&this->super_state_base + 1) +
                                           (ulong)is_match_model_index * 2 + 4)) * 4);
  uVar1 = *(ushort *)((long)this->m_lit_table + uVar4 * 2 + -100);
  if (match_hist_index != 0) {
    lVar7 = lVar7 + (ulong)*(uint *)(gProbCost + (ulong)uVar1 * 4);
    uVar1 = *(ushort *)((long)this->m_lit_table + uVar4 * 2 + -0x34);
    if (match_hist_index != 1) {
      lVar7 = lVar7 + (ulong)*(uint *)(gProbCost + (ulong)uVar1 * 4);
      uVar1 = *(ushort *)(this->m_lit_table[0].m_unused_alignment + uVar4 * 2 + -0x6c);
      uVar5 = (ulong)uVar1;
      if (match_hist_index == 2) {
        uVar5 = (ulong)(0x800 - uVar1);
      }
      goto LAB_00109108;
    }
  }
  uVar5 = (ulong)(0x800 - uVar1);
LAB_00109108:
  lVar7 = (ulong)*(uint *)(gProbCost + uVar5 * 4) + lVar7;
  if (match_hist_index == 0) {
    if (min_len == 1) {
      pBitcosts[1] = (ulong)*(uint *)(gProbCost +
                                     (ulong)(0x800 - *(ushort *)
                                                      ((long)this->m_lit_table + uVar4 * 2 + -0x4c))
                                     * 4) + lVar7;
      min_len = 2;
    }
    if (min_len <= max_len) {
      uVar2 = *(uint *)(gProbCost +
                       (ulong)*(ushort *)((long)this->m_lit_table + uVar4 * 2 + -0x4c) * 4);
      puVar3 = this->m_rep_len_table[6 < uVar4].super_raw_quasi_adaptive_huffman_data_model.
               m_code_sizes.m_p;
      lVar6 = 0;
      do {
        pBitcosts[min_len + lVar6] =
             (long)(int)((uint)puVar3[(uint)(min_len + -2 + (int)lVar6)] << 0x18) +
             lVar7 + (ulong)uVar2;
        lVar6 = lVar6 + 1;
      } while ((max_len - min_len) + 1 != (int)lVar6);
    }
  }
  else if (min_len <= max_len) {
    puVar3 = this->m_rep_len_table[6 < uVar4].super_raw_quasi_adaptive_huffman_data_model.
             m_code_sizes.m_p;
    lVar6 = 0;
    do {
      pBitcosts[min_len + lVar6] =
           (int)((uint)puVar3[(uint)(min_len + -2 + (int)lVar6)] << 0x18) + lVar7;
      lVar6 = lVar6 + 1;
    } while ((max_len - min_len) + 1 != (int)lVar6);
  }
  return;
}

Assistant:

void lzcompressor::state::get_rep_match_costs(uint dict_pos, bit_cost_t *pBitcosts, uint match_hist_index, int min_len, int max_len, uint is_match_model_index) const
   {
      dict_pos;
      // match
      const sym_data_model &rep_len_table = m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates];

      bit_cost_t base_cost = m_is_match_model[is_match_model_index].get_cost(1);

      base_cost += m_is_rep_model[m_cur_state].get_cost(1);

      if (!match_hist_index)
      {
         // rep0 match
         base_cost += m_is_rep0_model[m_cur_state].get_cost(1);
      }
      else
      {
         // rep1-rep3 matches
         base_cost += m_is_rep0_model[m_cur_state].get_cost(0);

         if (match_hist_index == 1)
         {
            // rep1
            base_cost += m_is_rep1_model[m_cur_state].get_cost(1);
         }
         else
         {
            base_cost += m_is_rep1_model[m_cur_state].get_cost(0);

            if (match_hist_index == 2)
            {
               // rep2
               base_cost += m_is_rep2_model[m_cur_state].get_cost(1);
            }
            else
            {
               // rep3
               base_cost += m_is_rep2_model[m_cur_state].get_cost(0);
            }
         }
      }

      // rep match
      if (!match_hist_index)
      {
         if (min_len == 1)
         {
            // single byte rep0
            pBitcosts[1] = base_cost + m_is_rep0_single_byte_model[m_cur_state].get_cost(1);
            min_len++;
         }

         bit_cost_t rep0_match_base_cost = base_cost + m_is_rep0_single_byte_model[m_cur_state].get_cost(0);
         for (int match_len = min_len; match_len <= max_len; match_len++)
         {
            // normal rep0
            pBitcosts[match_len] = rep0_match_base_cost + rep_len_table.get_cost(match_len - cMinMatchLen);
         }
      }
      else
      {
         for (int match_len = min_len; match_len <= max_len; match_len++)
         {
            pBitcosts[match_len] = base_cost + rep_len_table.get_cost(match_len - cMinMatchLen);
         }
      }
   }